

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageUtil.cpp
# Opt level: O1

deUint32 __thiscall vkt::pipeline::TestTexture::getSize(TestTexture *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  deUint32 dVar4;
  int iVar5;
  ulong uVar6;
  int levelNdx;
  vector<unsigned_int,_std::allocator<unsigned_int>_> offsetMultiples;
  ConstPixelBufferAccess level;
  uint local_8c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_88;
  uint local_64;
  TestTexture *local_60;
  TextureFormat local_58;
  int local_50;
  int local_4c;
  int local_48;
  
  local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  local_58.order = LA;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
            (&local_88,(iterator)0x0,&local_58.order);
  (*this->_vptr_TestTexture[8])(&local_58,this,0,0);
  local_64 = tcu::TextureFormat::getPixelSize(&local_58);
  if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&local_88,
               (iterator)
               local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_64);
  }
  else {
    *local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_finish = local_64;
    local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  dVar4 = 0;
  local_60 = this;
  for (local_8c = 0; iVar3 = (*this->_vptr_TestTexture[2])(this), (int)local_8c < iVar3;
      local_8c = local_8c + 1) {
    uVar6 = 0;
    while( true ) {
      iVar3 = (*this->_vptr_TestTexture[4])(this);
      if (iVar3 <= (int)uVar6) break;
      (*this->_vptr_TestTexture[8])(&local_58,this,(ulong)local_8c,uVar6);
      dVar4 = getNextMultiple(&local_88,dVar4);
      iVar2 = local_48;
      iVar1 = local_4c;
      iVar3 = local_50;
      iVar5 = tcu::TextureFormat::getPixelSize(&local_58);
      dVar4 = iVar2 * iVar5 * iVar1 * iVar3 + dVar4;
      uVar6 = (ulong)((int)uVar6 + 1);
      this = local_60;
    }
  }
  if (local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return dVar4;
}

Assistant:

deUint32 TestTexture::getSize (void) const
{
	std::vector<deUint32>	offsetMultiples;
	deUint32				textureSize = 0;

	offsetMultiples.push_back(4);
	offsetMultiples.push_back(getLevel(0, 0).getFormat().getPixelSize());

	for (int levelNdx = 0; levelNdx < getNumLevels(); levelNdx++)
	{
		for (int layerNdx = 0; layerNdx < getArraySize(); layerNdx++)
		{
			const tcu::ConstPixelBufferAccess level = getLevel(levelNdx, layerNdx);
			textureSize = getNextMultiple(offsetMultiples, textureSize);
			textureSize += level.getWidth() * level.getHeight() * level.getDepth() * level.getFormat().getPixelSize();
		}
	}

	return textureSize;
}